

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter1,
               GetterXsYRef<unsigned_char> *getter2,bool fit2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImPlotPlot *pIVar10;
  ImPlotRange *pIVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  long lVar14;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar15;
  byte bVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  byte local_8c;
  byte local_88;
  TransformerLinLin local_84;
  GetterXsYRef<unsigned_char> *local_80;
  GetterXsYs<unsigned_char> *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar2 = getter1->Count;
      if (0 < iVar2) {
        puVar8 = getter1->Xs;
        puVar9 = getter1->Ys;
        iVar3 = getter1->Offset;
        iVar4 = getter1->Stride;
        pIVar10 = GImPlot->CurrentPlot;
        iVar5 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        pIVar11 = GImPlot->ExtentsY;
        uVar7 = pIVar10->YAxis[iVar5].Flags;
        iVar17 = 0;
        uVar15 = uVar7 & 0x20;
        local_70 = (double)(CONCAT44(local_70._4_4_,uVar6) & 0xffffffff00000020);
        do {
          lVar14 = (long)(((iVar3 + iVar17) % iVar2 + iVar2) % iVar2) * (long)iVar4;
          bVar16 = puVar8[lVar14];
          dVar19 = (double)bVar16;
          bVar1 = puVar9[lVar14];
          dVar18 = (double)bVar1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((bVar16 != 0) || ((int)local_70 == 0)) {
LAB_001ecdbf:
              dVar20 = (pIVar12->ExtentsX).Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              (pIVar12->ExtentsX).Min = dVar21;
              dVar20 = (pIVar12->ExtentsX).Max;
              dVar21 = dVar19;
              if (dVar19 <= dVar20) {
                dVar21 = dVar20;
              }
              (pIVar12->ExtentsX).Max = dVar21;
            }
          }
          else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar18) &&
                   (dVar18 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                  (local_8c = (byte)((uVar6 & 0x20) >> 5), (bVar16 == 0 & local_8c) == 0))
          goto LAB_001ecdbf;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar15 == 0)) {
LAB_001ece1b:
              dVar19 = pIVar11[iVar5].Min;
              dVar20 = dVar18;
              if (dVar19 <= dVar18) {
                dVar20 = dVar19;
              }
              pIVar11[iVar5].Min = dVar20;
              dVar19 = pIVar12->ExtentsY[iVar5].Max;
              if (dVar18 <= dVar19) {
                dVar18 = dVar19;
              }
              pIVar12->ExtentsY[iVar5].Max = dVar18;
            }
          }
          else if ((((pIVar10->XAxis).Range.Min <= dVar19) && (dVar19 <= (pIVar10->XAxis).Range.Max)
                   ) && (local_88 = (byte)(uVar15 >> 5), (bVar1 == 0 & local_88) == 0))
          goto LAB_001ece1b;
          iVar17 = iVar17 + 1;
        } while (iVar2 != iVar17);
      }
      if ((fit2) && (iVar2 = getter2->Count, 0 < iVar2)) {
        puVar8 = getter2->Xs;
        iVar3 = getter2->Offset;
        iVar4 = getter2->Stride;
        dVar18 = getter2->YRef;
        pIVar10 = pIVar12->CurrentPlot;
        iVar5 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        uVar7 = pIVar10->YAxis[iVar5].Flags;
        local_70 = ABS(dVar18);
        bVar16 = dVar18 <= 0.0 & (byte)((uVar7 & 0x20) >> 5);
        iVar17 = 0;
        uVar15 = uVar6 & 0x20;
        do {
          bVar1 = puVar8[(long)(((iVar3 + iVar17) % iVar2 + iVar2) % iVar2) * (long)iVar4];
          dVar19 = (double)bVar1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar15 == 0)) {
LAB_001ecf45:
              dVar20 = (pIVar12->ExtentsX).Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              (pIVar12->ExtentsX).Min = dVar21;
              dVar20 = (pIVar12->ExtentsX).Max;
              dVar21 = dVar19;
              if (dVar19 <= dVar20) {
                dVar21 = dVar20;
              }
              (pIVar12->ExtentsX).Max = dVar21;
            }
          }
          else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar18) &&
                   (dVar18 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                  (local_8c = (byte)(uVar15 >> 5), (bVar1 == 0 & local_8c) == 0)) goto LAB_001ecf45;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((ulong)local_70 < 0x7ff0000000000000 && bVar16 == 0) {
LAB_001ecf7d:
              dVar19 = pIVar12->ExtentsY[iVar5].Min;
              dVar20 = dVar18;
              if (dVar19 <= dVar18) {
                dVar20 = dVar19;
              }
              pIVar12->ExtentsY[iVar5].Min = dVar20;
              dVar19 = pIVar12->ExtentsY[iVar5].Max;
              dVar20 = dVar18;
              if (dVar18 <= dVar19) {
                dVar20 = dVar19;
              }
              pIVar12->ExtentsY[iVar5].Max = dVar20;
            }
          }
          else if (((ulong)local_70 < 0x7ff0000000000000 && bVar16 == 0) &&
                   ((pIVar10->XAxis).Range.Min <= dVar19 && dVar19 <= (pIVar10->XAxis).Range.Max))
          goto LAB_001ecf7d;
          iVar17 = iVar17 + 1;
        } while (iVar2 != iVar17);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar12->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}